

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcsloop.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  NaPNEvent NVar5;
  char *pcVar6;
  size_t sVar7;
  undefined8 *puVar8;
  long *plVar9;
  long in_RSI;
  int in_EDI;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined8 uVar14;
  NaException *ex;
  NaPNEvent pnev;
  NaReal fStdDev;
  NaReal fMean;
  int nErrAccDepth;
  uint iSkip_e;
  uint iDelay_e;
  uint iSkip_y;
  uint iSkip_u;
  uint iDelay_y;
  uint iDelay_u;
  uint *output_delays;
  uint *input_delays;
  NaControlSystemModel csm;
  int iRun;
  NaReal fTotalTime;
  NaReal fStartTime;
  int nRuns;
  bool bUseCuSum;
  int len;
  char *nnc_mode;
  char *szFileName_1;
  NaControllerKind ckind;
  NaVector vInitial;
  char *szFileName;
  NaNNUnit au_nnp;
  NaNNUnit au_nnc;
  anon_enum_32 eContrType;
  anon_enum_32 ePlantType;
  NaStateSpaceModel au_ssmplant;
  NaStateSpaceModel au_ssmcontr;
  NaCombinedFunc au_lincontr;
  NaCombinedFunc au_linplant;
  NaCombinedFunc noise_tf;
  NaCombinedFunc refer_tf;
  anon_enum_32 inp_data_mode;
  anon_enum_32 contr_kind;
  NaParams par;
  NaCombinedFunc *in_stack_ffffffffffff9478;
  NaControlSystemModel *in_stack_ffffffffffff9480;
  NaControlSystemModel *in_stack_ffffffffffff94f0;
  NaControlSystemModel *in_stack_ffffffffffff9508;
  NaControllerKind in_stack_ffffffffffff9618;
  int in_stack_ffffffffffff961c;
  NaControlSystemModel *in_stack_ffffffffffff9620;
  uint local_6754;
  uint local_6748;
  uint local_6744;
  NaControlSystemModel local_6728;
  int local_260c;
  double local_2608;
  double local_2600;
  uint local_25f4;
  byte local_25ed;
  int local_25ec;
  char *local_25e8;
  char *local_25e0;
  int local_25d4;
  NaVector local_25d0 [24];
  char *local_25b8;
  NaNNUnit local_25b0 [152];
  uint local_2518;
  uint local_2514;
  NaNNUnit local_1fc0 [152];
  uint local_1f28;
  uint local_19d0;
  uint local_19cc;
  NaStateSpaceModel local_19c8 [224];
  NaStateSpaceModel local_18e8 [224];
  NaCombinedFunc local_1808 [1264];
  NaCombinedFunc local_1318 [1264];
  NaCombinedFunc local_e28 [1264];
  NaCombinedFunc local_938 [1264];
  int local_448;
  int local_444;
  int local_440;
  NaParams local_430 [1056];
  long local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 2) {
    fprintf(_stderr,"Usage: dcsloop ParamFile [Extra name=value pairs]\n");
    return 1;
  }
  local_10 = in_RSI;
  NaParams::NaParams(local_430,*(char **)(in_RSI + 8),in_EDI + -2,(char **)(in_RSI + 0x10),"#=");
  NaPrintLog("Run dcsloop with %s\n",*(undefined8 *)(local_10 + 8));
  NaParams::ListOfParamsToLog();
  pcVar6 = NaParams::operator()
                     ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
  iVar2 = strcmp("lin",pcVar6);
  if (iVar2 == 0) {
    NaPrintLog("Using linear controller in control system loop\n");
    local_440 = 0;
  }
  else {
    pcVar6 = NaParams::operator()
                       ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
    iVar2 = strcmp("nnc",pcVar6);
    if (iVar2 != 0) {
      NaPrintLog("Bad or undefined contr_kind value in .par file\n");
      local_4 = 0;
      local_444 = 1;
      goto LAB_00107a77;
    }
    NaPrintLog("Using neural net controller in control system loop\n");
    local_440 = 1;
  }
  pcVar6 = NaParams::operator()
                     ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
  iVar2 = strcmp("stream",pcVar6);
  if (iVar2 == 0) {
    NaPrintLog("Using stream reference and noise (transfer functions)\n");
    local_448 = 0;
  }
  else {
    pcVar6 = NaParams::operator()
                       ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
    iVar2 = strcmp("file",pcVar6);
    if (iVar2 != 0) {
      NaPrintLog("Bad or undefined input_kind value in .par file\n");
      local_4 = 0;
      local_444 = 1;
      goto LAB_00107a77;
    }
    NaPrintLog("Using limited reference and noise series (data files)\n");
    local_448 = 1;
  }
  NaCombinedFunc::NaCombinedFunc(local_938);
  NaCombinedFunc::NaCombinedFunc(local_e28);
  NaCombinedFunc::NaCombinedFunc(local_1318);
  NaCombinedFunc::NaCombinedFunc(local_1808);
  NaStateSpaceModel::NaStateSpaceModel(local_18e8);
  NaStateSpaceModel::NaStateSpaceModel(local_19c8);
  NaNNUnit::NaNNUnit(local_1fc0);
  NaNNUnit::NaNNUnit(local_25b0);
  pcVar6 = NaParams::operator()
                     ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
  local_25b8 = pcVar6;
  sVar7 = strlen(pcVar6);
  iVar2 = strcmp(pcVar6 + (sVar7 - 4),".ssm");
  if (iVar2 != 0) {
    NaCombinedFunc::Load((char *)local_1318);
  }
  else {
    NaStateSpaceModel::Load((char *)local_19c8);
  }
  local_19cc = (uint)(iVar2 == 0);
  NaVector::NaVector(local_25d0,1);
  if (local_440 == 0) {
    pcVar6 = NaParams::operator()
                       ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
    local_25e0 = pcVar6;
    sVar7 = strlen(pcVar6);
    iVar2 = strcmp(pcVar6 + (sVar7 - 4),".ssm");
    if (iVar2 != 0) {
      NaCombinedFunc::Load((char *)local_1808);
    }
    else {
      NaStateSpaceModel::Load((char *)local_18e8);
    }
    local_19d0 = (uint)(iVar2 == 0);
    NaVector::init_zero();
    bVar1 = NaParams::CheckParam((char *)local_430);
    if ((bVar1 & 1) == 0) {
      bVar1 = NaParams::CheckParam((char *)local_430);
      if ((bVar1 & 1) != 0) {
        pcVar6 = NaParams::operator()
                           ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478)
        ;
        dVar10 = atof(pcVar6);
        NaVector::init_value(dVar10);
      }
    }
    else {
      pcVar6 = NaParams::operator()
                         ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      dVar10 = atof(pcVar6);
      NaVector::init_value(dVar10);
    }
    local_25d4 = 0;
  }
  else if (local_440 == 1) {
    NaParams::operator()((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
    NaNNUnit::Load((char *)local_1fc0);
    if (local_1f28 < 2) {
      local_25d4 = 2;
    }
    else {
      local_25d4 = 1;
    }
    local_25e8 = NaParams::operator()
                           ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478)
    ;
    iVar2 = strcmp(local_25e8,"e+r+se");
    if ((iVar2 == 0) || (iVar2 = strcmp(local_25e8,"r+e+se"), iVar2 == 0)) {
      local_25d4 = 5;
    }
    else {
      iVar2 = strcmp(local_25e8,"e+r");
      if ((iVar2 == 0) || (iVar2 = strcmp(local_25e8,"r+e"), iVar2 == 0)) {
        local_25d4 = 2;
      }
      else {
        iVar2 = strcmp(local_25e8,"e+de");
        if (iVar2 == 0) {
          local_25d4 = 3;
        }
        else {
          iVar2 = strcmp(local_25e8,"e+e+...");
          if (iVar2 == 0) {
            local_25d4 = 1;
          }
        }
      }
    }
  }
  if (local_448 == 0) {
    NaParams::operator()((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
    NaCombinedFunc::Load((char *)local_938);
    NaParams::operator()((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
    NaCombinedFunc::Load((char *)local_e28);
    pcVar6 = NaParams::operator()
                       ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
    local_25ec = atoi(pcVar6);
  }
  else if (local_448 == 1) {
    local_25ec = 0;
  }
  local_25ed = NaParams::CheckParam((char *)local_430);
  local_25ed = local_25ed & 1;
  pcVar6 = NaParams::operator()
                     ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
  local_25f4 = atoi(pcVar6);
  pcVar6 = NaParams::operator()
                     ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
  local_2600 = atof(pcVar6);
  if (local_2600 < 0.0) {
    local_2600 = 0.0;
  }
  if ((((local_25ed & 1) != 0) && ((int)local_25f4 < 1)) || ((local_25ed & 1) == 0)) {
    local_25f4 = 1;
  }
  local_2608 = 0.0;
  for (local_260c = 0; local_260c < (int)local_25f4; local_260c = local_260c + 1) {
    NaPrintLog("Run %d (of %d)\n",(ulong)(local_260c + 1),(ulong)local_25f4);
    NaControlSystemModel::NaControlSystemModel
              (in_stack_ffffffffffff9620,in_stack_ffffffffffff961c,in_stack_ffffffffffff9618);
    if (local_19cc == 0) {
      NaPrintLog("plant TF or COF function\n");
      NaControlSystemModel::set_plant_function(in_stack_ffffffffffff9480,in_stack_ffffffffffff9478);
    }
    else if (local_19cc == 1) {
      NaPrintLog("plant SS model\n");
      NaControlSystemModel::set_plant_ss_model
                (in_stack_ffffffffffff9480,(NaStateSpaceModel *)in_stack_ffffffffffff9478);
      bVar1 = NaParams::CheckParam((char *)local_430);
      if ((bVar1 & 1) == 0) {
        NaPrintLog("Warning: \'out_x\' parameter is not defined, \'out_x_default.dat\' file is used"
                  );
        NaPNFileOutput::set_output_filename((char *)&local_6728.plant_x);
      }
      else {
        NaParams::operator()
                  ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
        NaPNFileOutput::set_output_filename((char *)&local_6728.plant_x);
      }
    }
    bVar1 = NaParams::CheckParam((char *)local_430);
    if ((bVar1 & 1) == 0) {
      NaPNFileOutput::set_output_filename((char *)&local_6728.cerr_fout);
    }
    else {
      pcVar6 = NaParams::operator()
                         ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      NaPrintLog("Writing control error statistics to \'%s\' file.\n",pcVar6);
      NaParams::operator()((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      NaPNFileOutput::set_output_filename((char *)&local_6728.cerr_fout);
      bVar1 = NaParams::CheckParam((char *)local_430);
      if ((bVar1 & 1) != 0) {
        pcVar6 = NaParams::operator()
                           ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478)
        ;
        NaPNStatistics::configure_output((char *)&local_6728.statan_cerr,pcVar6);
      }
      bVar1 = NaParams::CheckParam((char *)local_430);
      if ((bVar1 & 1) != 0) {
        pcVar6 = NaParams::operator()
                           ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478)
        ;
        atoi(pcVar6);
        NaPNStatistics::set_floating_gap((int)&local_6728 + 0x14b8);
      }
    }
    bVar1 = NaParams::CheckParam((char *)local_430);
    if ((((bVar1 & 1) == 0) || (bVar1 = NaParams::CheckParam((char *)local_430), (bVar1 & 1) == 0))
       || ((bVar1 = NaParams::CheckParam((char *)local_430), (bVar1 & 1) == 0 ||
           (bVar1 = NaParams::CheckParam((char *)local_430), (bVar1 & 1) == 0)))) {
      NaControlSystemModel::set_tdg_flag(&local_6728,false);
    }
    else {
      NaControlSystemModel::set_tdg_flag(&local_6728,true);
      pcVar6 = NaParams::operator()
                         ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      iVar2 = atoi(pcVar6);
      pcVar6 = NaParams::operator()
                         ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      atoi(pcVar6);
      pcVar6 = NaParams::operator()
                         ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      dVar10 = atof(pcVar6);
      pcVar6 = NaParams::operator()
                         ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      dVar11 = atof(pcVar6);
      NaPNTrainDataGath::set_parameters((int)&local_6728 + 0x3630,iVar2,dVar10,dVar11);
      bVar1 = NaParams::CheckParam((char *)local_430);
      if ((bVar1 & 1) == 0) {
        NaPNFileOutput::set_output_filename((char *)&local_6728.tdg_u);
      }
      else {
        NaParams::operator()
                  ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
        NaPNFileOutput::set_output_filename((char *)&local_6728.tdg_u);
      }
      bVar1 = NaParams::CheckParam((char *)local_430);
      if ((bVar1 & 1) == 0) {
        NaPNFileOutput::set_output_filename((char *)&local_6728.tdg_ny);
      }
      else {
        NaParams::operator()
                  ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
        NaPNFileOutput::set_output_filename((char *)&local_6728.tdg_ny);
      }
    }
    putenv("DRAND_SAFE=1");
    reset_rand();
    NaControlSystemModel::set_cusum_flag(&local_6728,(bool)(local_25ed & 1));
    pcVar6 = "OFF";
    if ((local_25ed & 1) != 0) {
      pcVar6 = "ON";
    }
    NaPrintLog("Cummulative sum detection is %s starting at %g\n",local_2600,pcVar6);
    if ((local_25ed & 1) != 0) {
      NaPNWatcher::attach_function
                ((_func_bool_void_ptr_NaVector_ptr_NaTimer_ptr *)&local_6728.dodetect,
                 OnDisorderDetection);
      bVar1 = NaParams::CheckParam((char *)local_430);
      if ((bVar1 & 1) != 0) {
        pcVar6 = NaParams::operator()
                           ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478)
        ;
        atof(pcVar6);
        NaPrintLog("Average time of alarm delay is %g\n");
        pcVar6 = NaParams::operator()
                           ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478)
        ;
        dVar10 = atof(pcVar6);
        NaPNCuSum::set_smart_detection(dVar10);
      }
    }
    bVar1 = NaParams::CheckParam((char *)local_430);
    if ((bVar1 & 1) != 0) {
      NaParams::operator()((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      NaNNUnit::Load((char *)local_25b0);
      NaPNNNUnit::set_nn_unit((NaNNUnit *)&local_6728.nnplant);
      NaPNTeacher::set_nn((NaPNNNUnit *)&local_6728.nnpback,(int)&local_6728 + 0x2528);
      bVar1 = NaParams::CheckParam((char *)local_430);
      if ((bVar1 & 1) == 0) {
        NaPNFileOutput::set_output_filename((char *)&local_6728.iderr_fout);
      }
      else {
        pcVar6 = NaParams::operator()
                           ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478)
        ;
        NaPrintLog("Writing identification error statistics to \'%s\' file.\n",pcVar6);
        NaParams::operator()
                  ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
        NaPNFileOutput::set_output_filename((char *)&local_6728.iderr_fout);
        bVar1 = NaParams::CheckParam((char *)local_430);
        if ((bVar1 & 1) != 0) {
          pcVar6 = NaParams::operator()
                             ((NaParams *)in_stack_ffffffffffff9480,
                              (char *)in_stack_ffffffffffff9478);
          NaPNStatistics::configure_output((char *)&local_6728.statan_iderr,pcVar6);
        }
        bVar1 = NaParams::CheckParam((char *)local_430);
        if ((bVar1 & 1) != 0) {
          pcVar6 = NaParams::operator()
                             ((NaParams *)in_stack_ffffffffffff9480,
                              (char *)in_stack_ffffffffffff9478);
          atoi(pcVar6);
          NaPNStatistics::set_floating_gap((int)&local_6728 + 0x2c90);
        }
      }
      NaNeuralNetDescr::InputDelays();
      NaNeuralNetDescr::OutputDelays();
      NaPNDelay::set_delay((int)&local_6728 + 0x30d0,(uint *)(ulong)local_2518);
      NaPNDelay::set_delay((int)&local_6728 + 0x2f00,(uint *)(ulong)local_2514);
      uVar3 = NaPNDelay::get_max_delay();
      uVar4 = NaPNDelay::get_max_delay();
      local_6744 = 0;
      local_6748 = 0;
      if (uVar4 < uVar3) {
        local_6748 = (uVar3 - uVar4) - 1;
      }
      else {
        local_6744 = (uVar4 - uVar3) + 1;
      }
      NaPNSkip::set_skip_number((int)&local_6728 + 0x2808);
      NaPNSkip::set_skip_number((int)&local_6728 + 0x2670);
      NaPNFill::set_fill_number((int)&local_6728 + 0x3480);
      NaPNSkip::set_skip_number((int)&local_6728 + 0x3cc0);
      NaPrintLog("delay_u=%d,  skip_u=%d\n",(ulong)uVar3,(ulong)local_6744);
      NaPrintLog("delay_y=%d,  skip_y=%d\n",(ulong)uVar4,(ulong)local_6748);
      NaPrintLog("delay_r=%d,  skip_r=%d\n",(ulong)(uVar4 + local_6748),
                 (ulong)(uVar4 + local_6748 + 1));
      bVar1 = NaParams::CheckParam((char *)local_430);
      if ((bVar1 & 1) == 0) {
        NaPNFileOutput::set_output_filename((char *)&local_6728.nn_y);
      }
      else {
        NaParams::operator()
                  ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
        NaPNFileOutput::set_output_filename((char *)&local_6728.nn_y);
        pcVar6 = NaParams::operator()
                           ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478)
        ;
        NaPrintLog("Writing NNP identification output to \'%s\' file.\n",pcVar6);
      }
      bVar1 = NaParams::CheckParam((char *)local_430);
      if ((bVar1 & 1) == 0) {
        NaPNFileOutput::set_output_filename((char *)&local_6728.nn_e);
      }
      else {
        NaParams::operator()
                  ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
        NaPNFileOutput::set_output_filename((char *)&local_6728.nn_e);
        in_stack_ffffffffffff9620 =
             (NaControlSystemModel *)
             NaParams::operator()
                       ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
        NaPrintLog("Writing NNP identification error to \'%s\' file.\n",in_stack_ffffffffffff9620);
      }
      bVar1 = NaParams::CheckParam((char *)local_430);
      in_stack_ffffffffffff961c = CONCAT13(bVar1,(int3)in_stack_ffffffffffff961c);
      if ((bVar1 & 1) == 0) {
        NaPNFileOutput::set_output_filename((char *)&local_6728.nnp_bpe);
      }
      else {
        NaParams::operator()
                  ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
        NaPNFileOutput::set_output_filename((char *)&local_6728.nnp_bpe);
        pcVar6 = NaParams::operator()
                           ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478)
        ;
        NaPrintLog("Writing NNP backpropagated error to \'%s\' file.\n",pcVar6);
      }
    }
    NaControlSystemModel::link_net(in_stack_ffffffffffff94f0);
    NaParams::operator()((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
    NaPNFileOutput::set_output_filename((char *)&local_6728.chkpnt_r);
    NaParams::operator()((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
    NaPNFileOutput::set_output_filename((char *)&local_6728.chkpnt_e);
    NaParams::operator()((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
    NaPNFileOutput::set_output_filename((char *)&local_6728.chkpnt_u);
    NaParams::operator()((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
    NaPNFileOutput::set_output_filename((char *)&local_6728.chkpnt_n);
    NaParams::operator()((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
    NaPNFileOutput::set_output_filename((char *)&local_6728.chkpnt_y);
    NaParams::operator()((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
    NaPNFileOutput::set_output_filename((char *)&local_6728.chkpnt_ny);
    if (local_25d4 == 5) {
      local_6754 = 0;
      bVar1 = NaParams::CheckParam((char *)local_430);
      if ((bVar1 & 1) != 0) {
        pcVar6 = NaParams::operator()
                           ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478)
        ;
        local_6754 = atoi(pcVar6);
      }
      NaPrintLog("Depth of error accumulation is %u\n",(ulong)local_6754);
      NaPNAccumulator::set_accum_depth((int)&local_6728 + 0x1c90);
    }
    if ((local_25ed & 1) != 0) {
      NaParams::operator()((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      NaPNFileOutput::set_output_filename((char *)&local_6728.cusum_out);
    }
    if (local_448 == 0) {
      NaPNRandomGen::set_generator_func((NaUnit *)&local_6728.setpnt_gen);
      NaPNRandomGen::set_gauss_distrib(0.0,1.0);
      NaPNRandomGen::set_generator_func((NaUnit *)&local_6728.noise_gen);
      NaPNRandomGen::set_gauss_distrib(0.0,1.0);
    }
    else if (local_448 == 1) {
      NaParams::operator()((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      NaPNFileInput::set_input_filename((char *)&local_6728.setpnt_inp);
      NaParams::operator()((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      NaPNFileInput::set_input_filename((char *)&local_6728.noise_inp);
    }
    NaControlSystemModel::set_initial_cerror
              (in_stack_ffffffffffff9480,(NaVector *)in_stack_ffffffffffff9478);
    if (local_440 == 0) {
      if (local_19d0 == 1) {
        NaPNTransfer::set_transfer_func((NaUnit *)&local_6728.controller);
      }
      else {
        NaPNTransfer::set_transfer_func((NaUnit *)&local_6728.controller);
      }
    }
    else if (local_440 == 1) {
      NaPNTransfer::set_transfer_func((NaUnit *)&local_6728.controller);
      bVar1 = NaParams::CheckParam((char *)local_430);
      if ((bVar1 & 1) == 0) {
        NaPNFileOutput::set_output_filename((char *)&local_6728.nn_x);
      }
      else {
        NaParams::operator()
                  ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
        NaPNFileOutput::set_output_filename((char *)&local_6728.nn_x);
      }
    }
    if ((local_25ed & 1) != 0) {
      pcVar6 = NaParams::operator()
                         ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      dVar10 = atof(pcVar6);
      pcVar6 = NaParams::operator()
                         ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      dVar11 = atof(pcVar6);
      pcVar6 = NaParams::operator()
                         ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      dVar12 = atof(pcVar6);
      in_stack_ffffffffffff9508 =
           (NaControlSystemModel *)
           NaParams::operator()
                     ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
      dVar13 = atof((char *)in_stack_ffffffffffff9508);
      NaPNCuSum::setup(dVar10,dVar11,dVar12,dVar13);
      NaPNCuSum::turn_on_at(local_2600);
      bVar1 = NaParams::CheckParam((char *)local_430);
      if ((bVar1 & 1) != 0) {
        in_stack_ffffffffffff94f0 =
             (NaControlSystemModel *)
             NaParams::operator()
                       ((NaParams *)in_stack_ffffffffffff9480,(char *)in_stack_ffffffffffff9478);
        iDetectInterval = atoi((char *)in_stack_ffffffffffff94f0);
      }
    }
    NVar5 = NaControlSystemModel::run_net(in_stack_ffffffffffff9508);
    puVar8 = (undefined8 *)NaVector::operator[]((int)&local_6728 + 0x15e0);
    printf("\nMean squared error=%g\n",*puVar8);
    NaPrintLog("IMPORTANT: net is dead due to ");
    switch(NVar5) {
    case pneDead:
      NaPrintLog("data are exhausted.\n");
      break;
    case pneHalted:
      NaPrintLog("internal halt.\n");
      break;
    case pneTerminate:
      NaPrintLog("user break.\n");
      break;
    case pneError:
      NaPrintLog("some error occured.\n");
      break;
    default:
      NaPrintLog("unknown reason.\n");
    }
    if ((local_25ed & 1) != 0) {
      printf("Number of disorder detections %d\n",(ulong)(uint)nDisorderCounter);
      NaPrintLog("Number of disorder detections %d\n",(ulong)(uint)nDisorderCounter);
      if (iDetectInterval < 0) {
        plVar9 = (long *)NaPetriNet::timer();
        dVar10 = (double)(**(code **)(*plVar9 + 0x20))();
        printf("Average time of false alarm %g\n",dVar10 / (double)nDisorderCounter);
        plVar9 = (long *)NaPetriNet::timer();
        dVar10 = (double)(**(code **)(*plVar9 + 0x20))();
        NaPrintLog("Average time of false alarm %g\n",dVar10 / (double)nDisorderCounter);
      }
      else if (iDetectInterval == 0) {
        plVar9 = (long *)NaPetriNet::timer();
        dVar10 = (double)(**(code **)(*plVar9 + 0x20))();
        local_2608 = local_2608 + (dVar10 - local_2600);
        plVar9 = (long *)NaPetriNet::timer();
        uVar14 = (**(code **)(*plVar9 + 0x20))();
        NaPrintLog("Time of alarm delay is %g\n",uVar14);
      }
    }
    NaPNStatistics::print_stat((char *)&local_6728.statan_r,(_IO_FILE *)"Statistics of set point:");
    NaPNStatistics::print_stat((char *)&local_6728.statan_cerr,(_IO_FILE *)"Statistics of error:");
    plVar9 = (long *)NaPetriNet::timer();
    (**(code **)(*plVar9 + 0x10))();
    NaControlSystemModel::~NaControlSystemModel(in_stack_ffffffffffff9480);
  }
  if ((1 < (int)local_25f4) && (iDetectInterval == 0)) {
    printf("Average time of alarm delay %g\n",local_2608 / (double)(int)local_25f4);
    NaPrintLog("Average time of alarm delay %g\n",local_2608 / (double)(int)local_25f4);
  }
  NaVector::~NaVector(local_25d0);
  NaNNUnit::~NaNNUnit(local_25b0);
  NaNNUnit::~NaNNUnit(local_1fc0);
  NaStateSpaceModel::~NaStateSpaceModel(local_19c8);
  NaStateSpaceModel::~NaStateSpaceModel(local_18e8);
  NaCombinedFunc::~NaCombinedFunc(local_1808);
  NaCombinedFunc::~NaCombinedFunc(local_1318);
  NaCombinedFunc::~NaCombinedFunc(local_e28);
  NaCombinedFunc::~NaCombinedFunc(local_938);
  local_444 = 0;
LAB_00107a77:
  NaParams::~NaParams(local_430);
  if (local_444 == 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
  if(argc < 2)
    {
      fprintf(stderr, "Usage: dcsloop ParamFile [Extra name=value pairs]\n");
      return 1;
    }

  try{
    NaParams	par(argv[1], argc - 2, argv + 2);

    NaPrintLog("Run dcsloop with %s\n", argv[1]);

    par.ListOfParamsToLog();

    /*************************************************************/
    enum {
      linear_contr,
      neural_contr
    }	contr_kind;

    if(!strcmp("lin", par("contr_kind")))
      {
	NaPrintLog("Using linear controller in control system loop\n");
	contr_kind = linear_contr;
      }
    else if(!strcmp("nnc", par("contr_kind")))
      {
	NaPrintLog("Using neural net controller in control system loop\n");
	contr_kind = neural_contr;
      }
    else
      {
	NaPrintLog("Bad or undefined contr_kind value in .par file\n");
	return 0;
      }

    /*************************************************************/
    enum {
      stream_mode,
      file_mode
    }	inp_data_mode;

    if(!strcmp("stream", par("input_kind")))
      {
	NaPrintLog("Using stream reference and noise (transfer functions)\n");
	inp_data_mode = stream_mode;
      }
    else if(!strcmp("file", par("input_kind")))
      {
	NaPrintLog("Using limited reference and noise series (data files)\n");
	inp_data_mode = file_mode;
      }
    else
      {
	NaPrintLog("Bad or undefined input_kind value in .par file\n");
	return 0;
      }


    /*************************************************************/
    // Applied units
    NaCombinedFunc	refer_tf;
    NaCombinedFunc	noise_tf;
    NaCombinedFunc	au_linplant;
    NaCombinedFunc	au_lincontr;
    NaStateSpaceModel	au_ssmcontr;
    NaStateSpaceModel	au_ssmplant;
    enum { TForCOF, SSModel } ePlantType, eContrType;
    NaNNUnit		au_nnc, au_nnp;


    // Load plant
    const char *szFileName = par("linplant_tf");
    if(!strcmp(szFileName + strlen(szFileName) - 4, ".ssm")) {
      au_ssmplant.Load(szFileName);
      ePlantType = SSModel;
    } else {
      // Otherwise let's try combined/transfer function
      au_linplant.Load(szFileName);
      ePlantType = TForCOF;
    }

    // Initial value of control error comparator
    NaVector	vInitial(1);

    // Type of controller
    NaControllerKind	ckind;

    // Load controller
    switch(contr_kind)
      {
      case linear_contr:
        {
	    // Load plant
	    const char *szFileName = par("lincontr_tf");
	    if(!strcmp(szFileName + strlen(szFileName) - 4, ".ssm")) {
		au_ssmcontr.Load(szFileName);
		eContrType = SSModel;
	    } else {
		// Otherwise let's try combined/transfer function
		au_lincontr.Load(szFileName);
		eContrType = TForCOF;
	    }

	    vInitial.init_zero();
	    if(par.CheckParam("cerror_initial_value"))
		vInitial.init_value(atof(par("cerror_initial_value")));
	    else if(par.CheckParam("plant_initial_state"))
		// old and wrong name for cerror_initial_value semantics
		vInitial.init_value(atof(par("plant_initial_state")));
	    ckind = NaLinearContr;
	}
	break;

      case neural_contr:
	au_nnc.Load(par("nncontr"));

	// Interpret NN-C structure

	// Default rule
	if(au_nnc.descr.nInputsRepeat > 1)
	  ckind = NaNeuralContrDelayedE;
	else
	  ckind = NaNeuralContrER;

	// Explicit rule
	{
	    const char *nnc_mode = par("nnc_mode");
	    if(!strcmp(nnc_mode, "e+r+se") ||
	       !strcmp(nnc_mode, "r+e+se"))
		ckind = NaNeuralContrERSumE;
	    else if(!strcmp(nnc_mode, "e+r") ||
		    !strcmp(nnc_mode, "r+e"))
		ckind = NaNeuralContrER;
	    else if(!strcmp(nnc_mode, "e+de"))
		ckind = NaNeuralContrEdE;
	    else if(!strcmp(nnc_mode, "e+e+..."))
		ckind = NaNeuralContrDelayedE;
	}
	break;
      }

    // Load input data
    int	len;
    switch(inp_data_mode)
      {
      case stream_mode:
	refer_tf.Load(par("refer_tf"));
	noise_tf.Load(par("noise_tf"));
	len = atoi(par("stream_len"));
	break;
      case file_mode:
	len = 0;
	break;
      }

    bool	bUseCuSum = par.CheckParam("cusum");
    int		nRuns = atoi(par("cusum_atad"));
    NaReal	fStartTime = atof(par("cusum_start_time"));
    if(fStartTime < 0.0)
      fStartTime= 0.0;
    if(bUseCuSum && nRuns <= 0 || !bUseCuSum)
      nRuns = 1;
    NaReal	fTotalTime = 0.0;
       
    for(int iRun = 0; iRun < nRuns; ++iRun)
      {
	NaPrintLog("Run %d (of %d)\n", 1+iRun, nRuns);
	NaControlSystemModel	csm(len, ckind);

	// Plant
	switch(ePlantType)
	  {
	  case TForCOF:
	    NaPrintLog("plant TF or COF function\n");
	    csm.set_plant_function(au_linplant);
	    break;

	  case SSModel:
	    NaPrintLog("plant SS model\n");
	    csm.set_plant_ss_model(au_ssmplant);
	    if(par.CheckParam("out_x"))
	      csm.plant_x.set_output_filename(par("out_x"));
	    else {
		NaPrintLog("Warning: 'out_x' parameter is not defined, 'out_x_default.dat' file is used");
		csm.plant_x.set_output_filename("out_x_default.dat");
	    }
	    break;
	  }

	if(par.CheckParam("cerr_trace_file")) {
	    NaPrintLog("Writing control error statistics to '%s' file.\n",
		       par("cerr_trace_file"));
	    csm.cerr_fout.set_output_filename(par("cerr_trace_file"));
	    if(par.CheckParam("cerr_trace_contents")) {
		csm.statan_cerr.configure_output(par("cerr_trace_contents"));
	    }
	    if(par.CheckParam("cerr_avg_base")) {
		csm.statan_cerr.set_floating_gap(atoi(par("cerr_avg_base")));
	    }
	} else {
	    csm.cerr_fout.set_output_filename(DEV_NULL);
	}

	if(par.CheckParam("tdg_stpardet_len") &&
	   par.CheckParam("tdg_cells") &&
	   par.CheckParam("tdg_sigma_num") &&
	   par.CheckParam("tdg_cover_percent"))
	  {
	    csm.set_tdg_flag(true);
	    csm.trdgath.set_parameters(atoi(par("tdg_stpardet_len")),
				       atoi(par("tdg_cells")),
				       atof(par("tdg_sigma_num")),
				       atof(par("tdg_cover_percent")));

	    if(par.CheckParam("tdg_u"))
	      csm.tdg_u.set_output_filename(par("tdg_u"));
	    else
	      csm.tdg_u.set_output_filename(DEV_NULL);
	    if(par.CheckParam("tdg_ny"))
	      csm.tdg_ny.set_output_filename(par("tdg_ny"));
	    else
	      csm.tdg_ny.set_output_filename(DEV_NULL);
	  }
	else
	  csm.set_tdg_flag(false);

	// Reset pseudo-random sequence
	putenv("DRAND_SAFE=1");
	reset_rand();

	// Set cummulative sum method is turned on or off
	csm.set_cusum_flag(bUseCuSum);
	NaPrintLog("Cummulative sum detection is %s starting at %g\n",
		   bUseCuSum? "ON": "OFF", fStartTime);
	if(bUseCuSum)
	  {
	    csm.dodetect.attach_function(OnDisorderDetection);
	    if(par.CheckParam("atad"))
	      {
		NaPrintLog("Average time of alarm delay is %g\n",
			   atof(par("atad")));
		csm.cusum.set_smart_detection(atof(par("atad")));
	      }
	  }

	// Setup parameters for NN-P
	if(par.CheckParam("in_nnp_file"))
	  {
	    //au_nnp.SetInstance("Plant");
	    au_nnp.Load(par("in_nnp_file"));
	    csm.nnplant.set_nn_unit(&au_nnp);
	    csm.nnpback.set_nn(&csm.nnplant);

	    if(par.CheckParam("iderr_trace_file")) {
		NaPrintLog("Writing identification error statistics to '%s' file.\n",
			   par("iderr_trace_file"));
		csm.iderr_fout.set_output_filename(par("iderr_trace_file"));
		if(par.CheckParam("iderr_trace_contents")) {
		    csm.statan_iderr
			.configure_output(par("iderr_trace_contents"));
		}
		if(par.CheckParam("iderr_avg_base")) {
		    csm.statan_iderr
			.set_floating_gap(atoi(par("iderr_avg_base")));
		}
	    } else {
		csm.iderr_fout.set_output_filename(DEV_NULL);
	    }

	    // Get NNP delays
	    unsigned	*input_delays = au_nnp.descr.InputDelays();
	    unsigned	*output_delays = au_nnp.descr.OutputDelays();

	    // Configure nodes
	    csm.delay_u.set_delay(au_nnp.descr.nInputsRepeat, input_delays);
	    csm.delay_y.set_delay(au_nnp.descr.nOutputsRepeat, output_delays);

	    unsigned	iDelay_u = csm.delay_u.get_max_delay();
	    unsigned	iDelay_y = csm.delay_y.get_max_delay();
	    unsigned	iSkip_u = 0, iSkip_y = 0;
	    unsigned	iDelay_e, iSkip_e;

	    // Skip u or y due to absent earlier values of y or u
	    if(iDelay_y >= iDelay_u)
	      {
		iSkip_u = iDelay_y - iDelay_u + 1;
	      }
	    else /* if(iDelay_u > iDelay_y) */
	      {
		iSkip_y = iDelay_u - iDelay_y - 1;
	      }
	    iDelay_e = iDelay_y + iSkip_y;
	    iSkip_e = 1 + iDelay_e;

	    csm.skip_u.set_skip_number(iSkip_u);
	    csm.skip_y.set_skip_number(iSkip_y);
	    csm.fill_nn_y.set_fill_number(iSkip_e);

	    // Additional delay for target value
	    csm.skip_r.set_skip_number(1 + iSkip_e);

	    NaPrintLog("delay_u=%d,  skip_u=%d\n", iDelay_u, iSkip_u);
	    NaPrintLog("delay_y=%d,  skip_y=%d\n", iDelay_y, iSkip_y);
	    NaPrintLog("delay_r=%d,  skip_r=%d\n", iDelay_e, iSkip_e);

	    if(par.CheckParam("out_nn_y")) {
		csm.nn_y.set_output_filename(par("out_nn_y"));
		NaPrintLog("Writing NNP identification output to '%s' file.\n",
			   par("out_nn_y"));
	    } else {
		csm.nn_y.set_output_filename(DEV_NULL);
	    }

	    if(par.CheckParam("out_nn_e")) {
		csm.nn_e.set_output_filename(par("out_nn_e"));
		NaPrintLog("Writing NNP identification error to '%s' file.\n",
			   par("out_nn_e"));
	    } else {
		csm.nn_e.set_output_filename(DEV_NULL);
	    }

	    if(par.CheckParam("out_nnp_bpe")) {
		csm.nnp_bpe.set_output_filename(par("out_nnp_bpe"));
		NaPrintLog("Writing NNP backpropagated error to '%s' file.\n",
			   par("out_nnp_bpe"));
	    } else {
		csm.nnp_bpe.set_output_filename(DEV_NULL);
	    }
	  }

	// Link the network
	csm.link_net();

	// Configure nodes
	csm.chkpnt_r.set_output_filename(par("out_r"));
	csm.chkpnt_e.set_output_filename(par("out_e"));
	csm.chkpnt_u.set_output_filename(par("out_u"));
	csm.chkpnt_n.set_output_filename(par("out_n"));
	csm.chkpnt_y.set_output_filename(par("out_y"));
	csm.chkpnt_ny.set_output_filename(par("out_ny"));

	if(NaNeuralContrERSumE == ckind) {
	    int nErrAccDepth = 0; // pure integration
	    if(par.CheckParam("err_acc_depth"))
		nErrAccDepth = atoi(par("err_acc_depth"));
	    NaPrintLog("Depth of error accumulation is %u\n", nErrAccDepth);
	    csm.err_acc.set_accum_depth(nErrAccDepth);
	}

	if(bUseCuSum)
	  csm.cusum_out.set_output_filename(par("cusum"));
      
	// Setpoint and noise
	NaReal	fMean = 0.0, fStdDev = 1.0;

	switch(inp_data_mode)
	  {
	  case stream_mode:
	    csm.setpnt_gen.set_generator_func(&refer_tf);
	    csm.setpnt_gen.set_gauss_distrib(fMean, fStdDev);

	    csm.noise_gen.set_generator_func(&noise_tf);
	    csm.noise_gen.set_gauss_distrib(fMean, fStdDev);
	    break;
	  case file_mode:
	    csm.setpnt_inp.set_input_filename(par("in_r"));
	    csm.noise_inp.set_input_filename(par("in_n"));
	    break;
	  }

	csm.set_initial_cerror(vInitial);

	// Controller
	switch(contr_kind)
	  {
	  case linear_contr:
	    if(SSModel == eContrType)
		csm.controller.set_transfer_func(&au_ssmcontr);
	    else
		csm.controller.set_transfer_func(&au_lincontr);
	    break;

	  case neural_contr:
	    csm.controller.set_transfer_func(&au_nnc);

	    if(par.CheckParam("nn_x"))
		csm.nn_x.set_output_filename(par("nn_x"));
	    else
		csm.nn_x.set_output_filename(DEV_NULL);
	    break;
	  }

	// Setup parameters for CUSUM (disorder detection)
	if(bUseCuSum)
	  {
	    csm.cusum.setup(atof(par("sigma0")), atof(par("sigma1")),
			    atof(par("h_sol")), atof(par("k_const")));
	    csm.cusum.turn_on_at(fStartTime);

	    if(par.CheckParam("detect_interval"))
	      iDetectInterval = atoi(par("detect_interval"));
	  }

	NaPNEvent   pnev = csm.run_net();

	printf("\nMean squared error=%g\n", csm.statan_cerr.RMS[0]);

	NaPrintLog("IMPORTANT: net is dead due to ");
	switch(pnev){
	case pneTerminate:
	  NaPrintLog("user break.\n");
	  break;

	case pneHalted:
	  NaPrintLog("internal halt.\n");
	  break;

	case pneDead:
	  NaPrintLog("data are exhausted.\n");
	  break;

	case pneError:
	  NaPrintLog("some error occured.\n");
	  break;

	default:
	  NaPrintLog("unknown reason.\n");
	  break;
	}

	if(bUseCuSum)
	  {
	    printf("Number of disorder detections %d\n", nDisorderCounter);
	    NaPrintLog("Number of disorder detections %d\n", nDisorderCounter);

	    if(iDetectInterval < 0)
	      {
		printf("Average time of false alarm %g\n",
		       csm.net.timer().CurrentTime()/nDisorderCounter);
		NaPrintLog("Average time of false alarm %g\n",
			   csm.net.timer().CurrentTime()/nDisorderCounter);
	      }
	    else if(iDetectInterval == 0)
	      {
		fTotalTime += csm.net.timer().CurrentTime() - fStartTime;
		NaPrintLog("Time of alarm delay is %g\n",
			   csm.net.timer().CurrentTime());
	      }
	  }
     
#if 0
	// Maximum absolute value of an set point
	NaReal  aMax_u;
	if(fabs(csm.statan_u.Min[0]) > fabs(csm.statan_u.Max[0])){
	  aMax = csm.statan_u.Min[0];
	}else{
	  aMax = csm.statan_u.Max[0];
	}
#endif

	csm.statan_r.print_stat("Statistics of set point:");
	csm.statan_cerr.print_stat("Statistics of error:");

	csm.net.timer().ResetTime();

      }/* End of numerous runs */

    if(nRuns > 1 && iDetectInterval == 0)
      {
	printf("Average time of alarm delay %g\n", fTotalTime / nRuns);
	NaPrintLog("Average time of alarm delay %g\n", fTotalTime / nRuns);
      }
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
    fprintf(stderr, "EXCEPTION: %s\n", NaExceptionMsg(ex));
  }

  return 0;
}